

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_xori_i32_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  TCGOp *pTVar1;
  TCGv_i32 arg2_00;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 == -1) {
    pTVar1 = tcg_emit_op_ppc64(tcg_ctx,INDEX_op_not_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    return;
  }
  if (arg2 == 0) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg1);
    return;
  }
  arg2_00 = tcg_const_i32_ppc64(tcg_ctx,arg2);
  tcg_gen_xor_i32(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_xori_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    /* Some cases can be optimized here.  */
    if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else if (arg2 == -1 && TCG_TARGET_HAS_not_i32) {
        /* Don't recurse with tcg_gen_not_i32.  */
        tcg_gen_op2_i32(tcg_ctx, INDEX_op_not_i32, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_xor_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}